

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-x86.c
# Opt level: O1

void sha1_process_x86(uint32_t *state,uint8_t *data,uint32_t length)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar3 = vpslldq_avx(ZEXT416(state[4]),0xc);
  auVar2 = vpshufd_avx(*(undefined1 (*) [16])state,0x1b);
  if (0x3f < length) {
    do {
      auVar11 = vpshufb_avx(*(undefined1 (*) [16])data,_DAT_001a8120);
      auVar4 = vpaddd_avx(auVar3,auVar11);
      auVar12 = sha1rnds4_sha(auVar2,auVar4,0);
      auVar4 = vpshufb_avx(*(undefined1 (*) [16])((long)data + 0x10),_DAT_001a8120);
      auVar10 = sha1nexte_sha(auVar2,auVar4);
      auVar14 = sha1rnds4_sha(auVar12,auVar10,0);
      auVar10 = sha1msg1_sha(auVar11,auVar4);
      auVar11 = vpshufb_avx(*(undefined1 (*) [16])((long)data + 0x20),_DAT_001a8120);
      auVar12 = sha1nexte_sha(auVar12,auVar11);
      auVar16 = sha1rnds4_sha(auVar14,auVar12,0);
      auVar12 = sha1msg1_sha(auVar4,auVar11);
      auVar4 = vpshufb_avx(*(undefined1 (*) [16])((long)data + 0x30),_DAT_001a8120);
      auVar14 = sha1nexte_sha(auVar14,auVar4);
      auVar10 = sha1msg2_sha(auVar10 ^ auVar11,auVar4);
      auVar17 = sha1rnds4_sha(auVar16,auVar14,0);
      auVar11 = sha1msg1_sha(auVar11,auVar4);
      auVar14 = sha1nexte_sha(auVar16,auVar10);
      auVar12 = sha1msg2_sha(auVar4 ^ auVar12,auVar10);
      auVar15 = sha1rnds4_sha(auVar17,auVar14,0);
      auVar13 = sha1msg1_sha(auVar4,auVar10);
      auVar4._0_4_ = auVar11._0_4_ ^ auVar10._0_4_;
      auVar4._4_4_ = auVar11._4_4_ ^ auVar10._4_4_;
      auVar4._8_4_ = auVar11._8_4_ ^ auVar10._8_4_;
      auVar4._12_4_ = auVar11._12_4_ ^ auVar10._12_4_;
      auVar11 = sha1nexte_sha(auVar17,auVar12);
      auVar4 = sha1msg2_sha(auVar4,auVar12);
      auVar16 = sha1rnds4_sha(auVar15,auVar11,1);
      auVar10 = sha1msg1_sha(auVar10,auVar12);
      auVar14._0_4_ = auVar13._0_4_ ^ auVar12._0_4_;
      auVar14._4_4_ = auVar13._4_4_ ^ auVar12._4_4_;
      auVar14._8_4_ = auVar13._8_4_ ^ auVar12._8_4_;
      auVar14._12_4_ = auVar13._12_4_ ^ auVar12._12_4_;
      auVar13 = sha1nexte_sha(auVar15,auVar4);
      auVar11 = sha1msg2_sha(auVar14,auVar4);
      auVar14 = sha1msg1_sha(auVar12,auVar4);
      auVar13 = sha1rnds4_sha(auVar16,auVar13,1);
      auVar17._0_4_ = auVar10._0_4_ ^ auVar4._0_4_;
      auVar17._4_4_ = auVar10._4_4_ ^ auVar4._4_4_;
      auVar17._8_4_ = auVar10._8_4_ ^ auVar4._8_4_;
      auVar17._12_4_ = auVar10._12_4_ ^ auVar4._12_4_;
      auVar10 = sha1nexte_sha(auVar16,auVar11);
      auVar12 = sha1msg2_sha(auVar17,auVar11);
      auVar16 = sha1rnds4_sha(auVar13,auVar10,1);
      auVar4 = sha1msg1_sha(auVar4,auVar11);
      auVar7._0_4_ = auVar14._0_4_ ^ auVar11._0_4_;
      auVar7._4_4_ = auVar14._4_4_ ^ auVar11._4_4_;
      auVar7._8_4_ = auVar14._8_4_ ^ auVar11._8_4_;
      auVar7._12_4_ = auVar14._12_4_ ^ auVar11._12_4_;
      auVar10 = sha1nexte_sha(auVar13,auVar12);
      auVar14 = sha1msg2_sha(auVar7,auVar12);
      auVar13 = sha1rnds4_sha(auVar16,auVar10,1);
      auVar10 = sha1msg1_sha(auVar11,auVar12);
      auVar11._0_4_ = auVar4._0_4_ ^ auVar12._0_4_;
      auVar11._4_4_ = auVar4._4_4_ ^ auVar12._4_4_;
      auVar11._8_4_ = auVar4._8_4_ ^ auVar12._8_4_;
      auVar11._12_4_ = auVar4._12_4_ ^ auVar12._12_4_;
      auVar16 = sha1nexte_sha(auVar16,auVar14);
      auVar4 = sha1msg2_sha(auVar11,auVar14);
      auVar15 = sha1rnds4_sha(auVar13,auVar16,1);
      auVar12 = sha1msg1_sha(auVar12,auVar14);
      auVar16._0_4_ = auVar10._0_4_ ^ auVar14._0_4_;
      auVar16._4_4_ = auVar10._4_4_ ^ auVar14._4_4_;
      auVar16._8_4_ = auVar10._8_4_ ^ auVar14._8_4_;
      auVar16._12_4_ = auVar10._12_4_ ^ auVar14._12_4_;
      auVar10 = sha1nexte_sha(auVar13,auVar4);
      auVar11 = sha1msg2_sha(auVar16,auVar4);
      auVar13 = sha1rnds4_sha(auVar15,auVar10,2);
      auVar10 = sha1msg1_sha(auVar14,auVar4);
      auVar5._0_4_ = auVar12._0_4_ ^ auVar4._0_4_;
      auVar5._4_4_ = auVar12._4_4_ ^ auVar4._4_4_;
      auVar5._8_4_ = auVar12._8_4_ ^ auVar4._8_4_;
      auVar5._12_4_ = auVar12._12_4_ ^ auVar4._12_4_;
      auVar14 = sha1nexte_sha(auVar15,auVar11);
      auVar12 = sha1msg2_sha(auVar5,auVar11);
      auVar16 = sha1rnds4_sha(auVar13,auVar14,2);
      auVar4 = sha1msg1_sha(auVar4,auVar11);
      auVar8._0_4_ = auVar10._0_4_ ^ auVar11._0_4_;
      auVar8._4_4_ = auVar10._4_4_ ^ auVar11._4_4_;
      auVar8._8_4_ = auVar10._8_4_ ^ auVar11._8_4_;
      auVar8._12_4_ = auVar10._12_4_ ^ auVar11._12_4_;
      auVar10 = sha1nexte_sha(auVar13,auVar12);
      auVar14 = sha1msg2_sha(auVar8,auVar12);
      auVar11 = sha1msg1_sha(auVar11,auVar12);
      auVar15 = sha1rnds4_sha(auVar16,auVar10,2);
      auVar10._0_4_ = auVar4._0_4_ ^ auVar12._0_4_;
      auVar10._4_4_ = auVar4._4_4_ ^ auVar12._4_4_;
      auVar10._8_4_ = auVar4._8_4_ ^ auVar12._8_4_;
      auVar10._12_4_ = auVar4._12_4_ ^ auVar12._12_4_;
      auVar16 = sha1nexte_sha(auVar16,auVar14);
      auVar4 = sha1msg2_sha(auVar10,auVar14);
      auVar17 = sha1rnds4_sha(auVar15,auVar16,2);
      auVar10 = sha1msg1_sha(auVar12,auVar14);
      auVar13._0_4_ = auVar11._0_4_ ^ auVar14._0_4_;
      auVar13._4_4_ = auVar11._4_4_ ^ auVar14._4_4_;
      auVar13._8_4_ = auVar11._8_4_ ^ auVar14._8_4_;
      auVar13._12_4_ = auVar11._12_4_ ^ auVar14._12_4_;
      auVar12 = sha1nexte_sha(auVar15,auVar4);
      auVar11 = sha1msg2_sha(auVar13,auVar4);
      auVar16 = sha1rnds4_sha(auVar17,auVar12,2);
      auVar12 = sha1msg1_sha(auVar14,auVar4);
      auVar6._0_4_ = auVar10._0_4_ ^ auVar4._0_4_;
      auVar6._4_4_ = auVar10._4_4_ ^ auVar4._4_4_;
      auVar6._8_4_ = auVar10._8_4_ ^ auVar4._8_4_;
      auVar6._12_4_ = auVar10._12_4_ ^ auVar4._12_4_;
      auVar14 = sha1nexte_sha(auVar17,auVar11);
      auVar10 = sha1msg2_sha(auVar6,auVar11);
      auVar13 = sha1rnds4_sha(auVar16,auVar14,3);
      auVar4 = sha1msg1_sha(auVar4,auVar11);
      auVar9._0_4_ = auVar12._0_4_ ^ auVar11._0_4_;
      auVar9._4_4_ = auVar12._4_4_ ^ auVar11._4_4_;
      auVar9._8_4_ = auVar12._8_4_ ^ auVar11._8_4_;
      auVar9._12_4_ = auVar12._12_4_ ^ auVar11._12_4_;
      auVar12 = sha1nexte_sha(auVar16,auVar10);
      auVar14 = sha1msg2_sha(auVar9,auVar10);
      auVar16 = sha1rnds4_sha(auVar13,auVar12,3);
      auVar11 = sha1msg1_sha(auVar11,auVar10);
      auVar12._0_4_ = auVar4._0_4_ ^ auVar10._0_4_;
      auVar12._4_4_ = auVar4._4_4_ ^ auVar10._4_4_;
      auVar12._8_4_ = auVar4._8_4_ ^ auVar10._8_4_;
      auVar12._12_4_ = auVar4._12_4_ ^ auVar10._12_4_;
      auVar10 = sha1nexte_sha(auVar13,auVar14);
      auVar4 = sha1msg2_sha(auVar12,auVar14);
      auVar10 = sha1rnds4_sha(auVar16,auVar10,3);
      auVar15._0_4_ = auVar11._0_4_ ^ auVar14._0_4_;
      auVar15._4_4_ = auVar11._4_4_ ^ auVar14._4_4_;
      auVar15._8_4_ = auVar11._8_4_ ^ auVar14._8_4_;
      auVar15._12_4_ = auVar11._12_4_ ^ auVar14._12_4_;
      auVar12 = sha1nexte_sha(auVar16,auVar4);
      auVar11 = sha1msg2_sha(auVar15,auVar4);
      auVar4 = sha1rnds4_sha(auVar10,auVar12,3);
      auVar11 = sha1nexte_sha(auVar10,auVar11);
      auVar11 = sha1rnds4_sha(auVar4,auVar11,3);
      auVar3 = sha1nexte_sha(auVar4,auVar3);
      auVar2 = vpaddd_avx(auVar11,auVar2);
      data = (uint8_t *)((long)data + 0x40);
      length = length - 0x40;
    } while (0x3f < length);
  }
  auVar2 = vpshufd_avx(auVar2,0x1b);
  *(undefined1 (*) [16])state = auVar2;
  uVar1 = vextractps_avx(auVar3,3);
  state[4] = uVar1;
  return;
}

Assistant:

void sha1_process_x86(uint32_t state[5], const uint8_t data[], uint32_t length)
{
    __m128i ABCD, ABCD_SAVE, E0, E0_SAVE, E1;
    __m128i MSG0, MSG1, MSG2, MSG3;
    const __m128i MASK = _mm_set_epi64x(0x0001020304050607ULL, 0x08090a0b0c0d0e0fULL);

    /* Load initial values */
    ABCD = _mm_loadu_si128((const __m128i*) state);
    E0 = _mm_set_epi32(state[4], 0, 0, 0);
    ABCD = _mm_shuffle_epi32(ABCD, 0x1B);

    while (length >= 64)
    {
        /* Save current state  */
        ABCD_SAVE = ABCD;
        E0_SAVE = E0;

        /* Rounds 0-3 */
        MSG0 = _mm_loadu_si128((const __m128i*)(data + 0));
        MSG0 = _mm_shuffle_epi8(MSG0, MASK);
        E0 = _mm_add_epi32(E0, MSG0);
        E1 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);

        /* Rounds 4-7 */
        MSG1 = _mm_loadu_si128((const __m128i*)(data + 16));
        MSG1 = _mm_shuffle_epi8(MSG1, MASK);
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 0);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);

        /* Rounds 8-11 */
        MSG2 = _mm_loadu_si128((const __m128i*)(data + 32));
        MSG2 = _mm_shuffle_epi8(MSG2, MASK);
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 12-15 */
        MSG3 = _mm_loadu_si128((const __m128i*)(data + 48));
        MSG3 = _mm_shuffle_epi8(MSG3, MASK);
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 0);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 16-19 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 20-23 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 24-27 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 1);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 28-31 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 32-35 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 1);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 36-39 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 40-43 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 44-47 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 2);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 48-51 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 52-55 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 2);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 56-59 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 60-63 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 64-67 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 3);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 68-71 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 72-75 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 3);

        /* Rounds 76-79 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);

        /* Combine state */
        E0 = _mm_sha1nexte_epu32(E0, E0_SAVE);
        ABCD = _mm_add_epi32(ABCD, ABCD_SAVE);

        data += 64;
        length -= 64;
    }

    /* Save state */
    ABCD = _mm_shuffle_epi32(ABCD, 0x1B);
    _mm_storeu_si128((__m128i*) state, ABCD);
    state[4] = _mm_extract_epi32(E0, 3);
}